

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

uint stb_hash2(char *str,uint *hash2_ptr)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *str;
  if (cVar3 == '\0') {
    uVar1 = 0x77f044ed;
    uVar2 = 0x3141592c;
  }
  else {
    pcVar4 = str + 1;
    uVar2 = 0x3141592c;
    uVar1 = 0x77f044ed;
    do {
      uVar2 = (uVar2 << 7 | uVar2 >> 0x19) + (int)cVar3;
      uVar1 = (uVar1 << 0xb | uVar1 >> 0x15) + (int)cVar3;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  *hash2_ptr = (uVar2 >> 0x10) + uVar1;
  return (uVar1 >> 0x10) + uVar2;
}

Assistant:

unsigned int stb_hash2(char *str, unsigned int *hash2_ptr)
{
   unsigned int hash1 = 0x3141592c;
   unsigned int hash2 = 0x77f044ed;
   while (*str) {
      hash1 = (hash1 << 7) + (hash1 >> 25) + *str;
      hash2 = (hash2 << 11) + (hash2 >> 21) + *str;
      ++str;
   }
   *hash2_ptr = hash2 + (hash1 >> 16);
   return       hash1 + (hash2 >> 16);
}